

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxbp.cpp
# Opt level: O2

void __thiscall libDAI::BoxBP::calcNewBox(BoxBP *this,FactorGraph *fg,size_t iI)

{
  pointer ppVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  unsigned_long uVar5;
  pointer pvVar6;
  undefined4 extraout_var_02;
  unsigned_long *puVar7;
  unsigned_long *puVar8;
  vector<libDAI::Box,_std::allocator<libDAI::Box>_> incoming;
  Var v_j;
  Var v_i;
  VarSet local_110;
  VarSet v_I;
  Box mjI;
  TFactor<double> local_80;
  VarSet local_48;
  
  ppVar1 = (fg->_fg)._E12.
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = ppVar1[iI].first;
  uVar3 = ppVar1[iI].second;
  iVar4 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[6])(fg,uVar2);
  v_i._label = *(long *)CONCAT44(extraout_var,iVar4);
  v_i._states = ((long *)CONCAT44(extraout_var,iVar4))[1];
  iVar4 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[10])(fg,uVar3);
  VarSet::VarSet(&v_I,(VarSet *)CONCAT44(extraout_var_00,iVar4));
  incoming.super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>._M_impl.
  super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x40;
  incoming.super__Vector_base<libDAI::Box,_std::allocator<libDAI::Box>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar6 = (fg->_fg)._nb2.
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (puVar7 = pvVar6[uVar3].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar7 != pvVar6[uVar3].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish; puVar7 = puVar7 + 1) {
    if (*puVar7 != uVar2) {
      iVar4 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[6])(fg);
      v_j._label = *(long *)CONCAT44(extraout_var_01,iVar4);
      v_j._states = ((long *)CONCAT44(extraout_var_01,iVar4))[1];
      VarSet::VarSet(&local_48,&v_j);
      Box::Box(&mjI,&local_48,1.0,1.0);
      std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_48);
      uVar5 = *puVar7;
      pvVar6 = (fg->_fg)._nb1.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (puVar8 = pvVar6[uVar5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          puVar8 != pvVar6[uVar5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish; puVar8 = puVar8 + 1) {
        if (*puVar8 != uVar3) {
          Box::operator*=(&mjI,(Box *)(*(long *)(*(long *)&(fg->_fg)._E12ind.
                                                                                                                      
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar5].
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data + *puVar8 * 8) *
                                       0x50 + *(long *)this));
          uVar5 = *puVar7;
          pvVar6 = (fg->_fg)._nb1.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
      }
      std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::push_back(&incoming,&mjI);
      Box::~Box(&mjI);
      pvVar6 = (fg->_fg)._nb2.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
  }
  iVar4 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[10])(fg,uVar3);
  TFactor<double>::TFactor(&local_80,(TFactor<double> *)CONCAT44(extraout_var_02,iVar4));
  VarSet::VarSet(&local_110,&v_i);
  boundSumProd(&mjI,&local_80,&incoming,&local_110,true,true);
  Box::operator=((Box *)(iI * 0x50 + *(long *)this),&mjI);
  Box::~Box(&mjI);
  std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
            ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_110);
  TFactor<double>::~TFactor(&local_80);
  std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::~vector(&incoming);
  std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
            ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&v_I);
  return;
}

Assistant:

void BoxBP::calcNewBox( const FactorGraph &fg, size_t iI ) {
        size_t i = fg.edge(iI).first;
        size_t I = fg.edge(iI).second;
        Var v_i = fg.var(i);
        VarSet v_I = fg.factor(I).vars();

        vector<Box> incoming;
        for( FactorGraph::nb_cit j = fg.nbF(I).begin(); j != fg.nbF(I).end(); j++ )
            if( *j != i ) {
                Var v_j = fg.var(*j);
                Box mjI( v_j, 1.0, 1.0 );
                for( FactorGraph::nb_cit J = fg.nbV(*j).begin(); J != fg.nbV(*j).end(); J++ ) 
                    if( *J != I )
                        mjI *= box( fg, *j, *J );
                incoming.push_back( mjI );
            }
        _boxes[iI] = boundSumProd( fg.factor(I), incoming, v_i, true, true );
    }